

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_heap.h
# Opt level: O2

void __thiscall csbpl_common::Heap<double>::insert(Heap<double> *this,Ptr *e)

{
  double dVar1;
  pointer psVar2;
  double *pdVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  Ptr temp;
  
  ((e->super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ->heap_index_ =
       (int)((ulong)((long)(this->data_).
                           super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->data_).
                          super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4);
  std::
  vector<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
  ::push_back(&this->data_,e);
  iVar4 = (int)((ulong)((long)(this->data_).
                              super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->data_).
                             super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4);
  uVar7 = 0xffffffffffffffff;
  iVar6 = iVar4 + -1;
  if (iVar6 != 0) {
    uVar7 = (long)(iVar4 + -2) / 2;
  }
  uVar7 = uVar7 & 0xffffffff;
  while( true ) {
    iVar4 = (int)uVar7;
    if (iVar4 == -1) {
      return;
    }
    psVar2 = (this->data_).
             super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar3 = &(psVar2[iVar6].
               super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->key_;
    dVar1 = (psVar2[iVar4].
             super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->key_;
    if (dVar1 < *pdVar3 || dVar1 == *pdVar3) break;
    std::__shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&temp.
                super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>,
               &psVar2[iVar6].
                super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>)
    ;
    psVar2 = (this->data_).
             super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::__shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&psVar2[iVar6].
                super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>,
               &psVar2[iVar4].
                super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>)
    ;
    psVar2 = (this->data_).
             super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(int *)((long)psVar2[iVar6].
                   super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr + 8) = iVar6;
    std::__shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&psVar2[iVar4].
                super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>,
               &temp.
                super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>)
    ;
    *(int *)((long)(this->data_).
                   super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar4].
                   super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr + 8) = iVar4;
    uVar5 = 0xffffffff;
    if (iVar4 != 0) {
      uVar5 = (iVar4 + -1) / 2;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&temp.
                super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    uVar7 = (ulong)uVar5;
    iVar6 = iVar4;
  }
  return;
}

Assistant:

void insert(Ptr e)
  {
    e->heap_index_ = static_cast<int>(data_.size());
    data_.push_back(e);

    // Percolate up
    int i = size() - 1;
    int parent = getParent(i);
    while (parent != -1 && data_[i]->key_ < data_[parent]->key_)
    {
      // Perform a swap
      Ptr temp = data_[i];
      data_[i] = data_[parent];
      data_[i]->heap_index_ = i;
      data_[parent] = temp;
      data_[parent]->heap_index_ = parent;
      // Continue to percolate up the tree
      i = parent;
      parent = getParent(parent);
    }
  }